

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-sockets.c
# Opt level: O0

int lws_plat_if_up(char *ifname,int fd,int up)

{
  int iVar1;
  char local_48 [8];
  ifreq ifr;
  int up_local;
  int fd_local;
  char *ifname_local;
  
  ifr.ifr_ifru._16_4_ = up;
  ifr.ifr_ifru._20_4_ = fd;
  memset(local_48,0,0x28);
  lws_strncpy(local_48,ifname,0x10);
  iVar1 = ioctl(ifr.ifr_ifru._20_4_,0x8913,local_48);
  if (iVar1 < 0) {
    _lws_log(1,"%s: SIOCGIFFLAGS fail\n","lws_plat_if_up");
    ifname_local._4_4_ = 1;
  }
  else {
    if (ifr.ifr_ifru._16_4_ == 0) {
      ifr.ifr_ifrn._8_2_ = ifr.ifr_ifrn._8_2_ & 0xfffe;
    }
    else {
      ifr.ifr_ifrn._8_2_ = ifr.ifr_ifrn._8_2_ | 1;
    }
    iVar1 = ioctl(ifr.ifr_ifru._20_4_,0x8914,local_48);
    if (iVar1 < 0) {
      _lws_log(1,"%s: SIOCSIFFLAGS fail\n","lws_plat_if_up");
      ifname_local._4_4_ = 1;
    }
    else {
      ifname_local._4_4_ = 0;
    }
  }
  return ifname_local._4_4_;
}

Assistant:

int
lws_plat_if_up(const char *ifname, int fd, int up)
{
#if defined(__linux__)
	struct ifreq ifr;

	memset(&ifr, 0, sizeof(ifr));
	lws_strncpy(ifr.ifr_name, ifname, IFNAMSIZ);

	if (ioctl(fd, SIOCGIFFLAGS, &ifr) < 0) {
		lwsl_err("%s: SIOCGIFFLAGS fail\n", __func__);
		return 1;
	}

	if (up)
		ifr.ifr_flags |= IFF_UP;
	else
		ifr.ifr_flags &= ~IFF_UP;

	if (ioctl(fd, SIOCSIFFLAGS, &ifr) < 0) {
		lwsl_err("%s: SIOCSIFFLAGS fail\n", __func__);
		return 1;
	}

	return 0;
#else
	lwsl_err("%s: UNIMPLEMENTED on this platform\n", __func__);

	return -1;
#endif
}